

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_video_capture(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_video_capture != 0) {
    glad_glBeginVideoCaptureNV = (PFNGLBEGINVIDEOCAPTURENVPROC)(*load)("glBeginVideoCaptureNV");
    glad_glBindVideoCaptureStreamBufferNV =
         (PFNGLBINDVIDEOCAPTURESTREAMBUFFERNVPROC)(*load)("glBindVideoCaptureStreamBufferNV");
    glad_glBindVideoCaptureStreamTextureNV =
         (PFNGLBINDVIDEOCAPTURESTREAMTEXTURENVPROC)(*load)("glBindVideoCaptureStreamTextureNV");
    glad_glEndVideoCaptureNV = (PFNGLENDVIDEOCAPTURENVPROC)(*load)("glEndVideoCaptureNV");
    glad_glGetVideoCaptureivNV = (PFNGLGETVIDEOCAPTUREIVNVPROC)(*load)("glGetVideoCaptureivNV");
    glad_glGetVideoCaptureStreamivNV =
         (PFNGLGETVIDEOCAPTURESTREAMIVNVPROC)(*load)("glGetVideoCaptureStreamivNV");
    glad_glGetVideoCaptureStreamfvNV =
         (PFNGLGETVIDEOCAPTURESTREAMFVNVPROC)(*load)("glGetVideoCaptureStreamfvNV");
    glad_glGetVideoCaptureStreamdvNV =
         (PFNGLGETVIDEOCAPTURESTREAMDVNVPROC)(*load)("glGetVideoCaptureStreamdvNV");
    glad_glVideoCaptureNV = (PFNGLVIDEOCAPTURENVPROC)(*load)("glVideoCaptureNV");
    glad_glVideoCaptureStreamParameterivNV =
         (PFNGLVIDEOCAPTURESTREAMPARAMETERIVNVPROC)(*load)("glVideoCaptureStreamParameterivNV");
    glad_glVideoCaptureStreamParameterfvNV =
         (PFNGLVIDEOCAPTURESTREAMPARAMETERFVNVPROC)(*load)("glVideoCaptureStreamParameterfvNV");
    glad_glVideoCaptureStreamParameterdvNV =
         (PFNGLVIDEOCAPTURESTREAMPARAMETERDVNVPROC)(*load)("glVideoCaptureStreamParameterdvNV");
  }
  return;
}

Assistant:

static void load_GL_NV_video_capture(GLADloadproc load) {
	if(!GLAD_GL_NV_video_capture) return;
	glad_glBeginVideoCaptureNV = (PFNGLBEGINVIDEOCAPTURENVPROC)load("glBeginVideoCaptureNV");
	glad_glBindVideoCaptureStreamBufferNV = (PFNGLBINDVIDEOCAPTURESTREAMBUFFERNVPROC)load("glBindVideoCaptureStreamBufferNV");
	glad_glBindVideoCaptureStreamTextureNV = (PFNGLBINDVIDEOCAPTURESTREAMTEXTURENVPROC)load("glBindVideoCaptureStreamTextureNV");
	glad_glEndVideoCaptureNV = (PFNGLENDVIDEOCAPTURENVPROC)load("glEndVideoCaptureNV");
	glad_glGetVideoCaptureivNV = (PFNGLGETVIDEOCAPTUREIVNVPROC)load("glGetVideoCaptureivNV");
	glad_glGetVideoCaptureStreamivNV = (PFNGLGETVIDEOCAPTURESTREAMIVNVPROC)load("glGetVideoCaptureStreamivNV");
	glad_glGetVideoCaptureStreamfvNV = (PFNGLGETVIDEOCAPTURESTREAMFVNVPROC)load("glGetVideoCaptureStreamfvNV");
	glad_glGetVideoCaptureStreamdvNV = (PFNGLGETVIDEOCAPTURESTREAMDVNVPROC)load("glGetVideoCaptureStreamdvNV");
	glad_glVideoCaptureNV = (PFNGLVIDEOCAPTURENVPROC)load("glVideoCaptureNV");
	glad_glVideoCaptureStreamParameterivNV = (PFNGLVIDEOCAPTURESTREAMPARAMETERIVNVPROC)load("glVideoCaptureStreamParameterivNV");
	glad_glVideoCaptureStreamParameterfvNV = (PFNGLVIDEOCAPTURESTREAMPARAMETERFVNVPROC)load("glVideoCaptureStreamParameterfvNV");
	glad_glVideoCaptureStreamParameterdvNV = (PFNGLVIDEOCAPTURESTREAMPARAMETERDVNVPROC)load("glVideoCaptureStreamParameterdvNV");
}